

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O2

int __thiscall
booster::aio::epoll_reactor::poll(epoll_reactor *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int __maxevents;
  epoll_data_t *peVar5;
  ulong uVar6;
  int *in_R8;
  uint uVar7;
  epoll_event fds [128];
  
  memset(fds,0,0x600);
  __maxevents = 0x80;
  if ((int)__nfds < 0x80) {
    __maxevents = (int)__nfds;
  }
  uVar3 = epoll_wait(this->pollfd_,(epoll_event *)fds,__maxevents,__timeout);
  if ((int)uVar3 < 0) {
    piVar4 = __errno_location();
    *in_R8 = *piVar4;
    uVar3 = 0xffffffff;
  }
  else {
    peVar5 = &fds[0].data;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = ((epoll_event *)((long)peVar5 + -4))->events;
      uVar7 = uVar1 >> 1 & 2;
      uVar2 = uVar7 + 4;
      if ((uVar1 & 0x1a) == 0) {
        uVar2 = uVar7;
      }
      *(uint *)&__fds[uVar6].events = uVar2 + (uVar1 & 1);
      __fds[uVar6].fd = peVar5->fd;
      peVar5 = (epoll_data_t *)((long)peVar5 + 0xc);
    }
  }
  return uVar3;
}

Assistant:

virtual int poll(reactor::event *events,int n,int timeout,int &error)
		{
			struct epoll_event fds[128] = {};
			if (n >128) n=128;

			int size = 0;
			size = ::epoll_wait(pollfd_,fds,n,timeout);
			
			if(size < 0) {
				error = errno;
				return -1;
			}
			int read = 0;
			for(int i=0;i<size;i++) {
				events[read].events = to_user_events(fds[i].events);
				events[read].fd = fds[i].data.fd; 
				read ++;
			}
			return read;
		}